

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

uint64_t __thiscall fmp4_stream::box::size(box *this)

{
  uint64_t local_18;
  uint64_t l_size;
  box *this_local;
  
  local_18 = 8;
  if ((this->is_large_ & 1U) != 0) {
    local_18 = 0x10;
  }
  if ((this->has_uuid_ & 1U) != 0) {
    local_18 = local_18 + 0x10;
  }
  return local_18;
}

Assistant:

uint64_t box::size()  const {
		uint64_t l_size = 8;
		if (is_large_)
			l_size += 8;
		if (has_uuid_)
			l_size += 16;
		return l_size;
	}